

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpFixed<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  FieldEntry *entry_00;
  uint64_t table_00;
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  FieldEntry *pFVar3;
  ParseContext *p;
  MessageLite *x;
  bool bVar4;
  unsigned_short uVar5;
  uint32_t uVar6;
  uint uVar7;
  char *pcVar8;
  LogMessage *pLVar9;
  unsigned_long uVar10;
  unsigned_long *puVar11;
  uint *puVar12;
  ulong uVar13;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1a0;
  void *local_198;
  void *base;
  undefined1 local_188 [16];
  LogMessageFatal local_178 [19];
  Voidify local_165;
  unsigned_short local_164;
  unsigned_short local_162;
  string *local_160;
  string *absl_log_internal_check_op_result;
  uint local_150;
  unsigned_short local_14a;
  uint32_t decoded_wiretype;
  uint16_t rep;
  ushort local_13c;
  ushort local_13a;
  uint16_t card;
  FieldEntry *pFStack_138;
  uint16_t type_card;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_f8;
  TcFieldData local_f0;
  undefined1 local_e1;
  FieldEntry *pFStack_e0;
  bool always_return;
  TcParseTableBase *local_d8;
  ParseContext *local_d0;
  ParseContext *local_c8;
  MessageLite *local_c0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_a8;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  
  entry = (FieldEntry *)hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar6 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  pFStack_138 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar6);
  local_13a = pFStack_138->type_card;
  local_13c = local_13a & 0x30;
  if (local_13c == 0x20) {
    _decoded_wiretype = msg_local;
    pcVar8 = MpRepeatedFixed<false>
                       ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                        (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
    return pcVar8;
  }
  local_14a = local_13a & 0x1c0;
  uVar6 = TcFieldData::tag((TcFieldData *)&msg_local);
  local_150 = uVar6 & 7;
  if (local_14a == 0xc0) {
    if (local_150 != 1) {
      absl_log_internal_check_op_result = (string *)msg_local;
      pcVar8 = (char *)(**(code **)(hasbits_local + 0x30))
                                 (ptr_local,ctx_local,table_local,msg_local,hasbits_local,entry);
      return pcVar8;
    }
  }
  else {
    local_162 = absl::lts_20240722::log_internal::GetReferenceableValue(local_14a);
    local_164 = absl::lts_20240722::log_internal::GetReferenceableValue(0x80);
    local_160 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                          (&local_162,&local_164,
                           "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    if (local_160 != (string *)0x0) {
      local_188 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_160);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_178,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x6c3,local_188._0_8_,local_188._8_8_);
      pLVar9 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_178)
      ;
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_165,pLVar9);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_178);
    }
    if (local_150 != 5) {
      base = msg_local;
      pcVar8 = (char *)(**(code **)(hasbits_local + 0x30))
                                 (ptr_local,ctx_local,table_local,msg_local,hasbits_local,entry);
      return pcVar8;
    }
    local_160 = (string *)0x0;
  }
  table_00 = hasbits_local;
  entry_00 = pFStack_138;
  if (local_13c == 0x10) {
    anon_unknown_130::SetHas(pFStack_138,(MessageLite *)ptr_local);
  }
  else if (local_13c == 0x30) {
    uVar6 = TcFieldData::tag((TcFieldData *)&msg_local);
    ChangeOneof((TcParseTableBase *)table_00,entry_00,uVar6 >> 3,(ParseContext *)table_local,
                (MessageLite *)ptr_local);
  }
  local_198 = MaybeGetSplitBase((MessageLite *)ptr_local,false,(TcParseTableBase *)hasbits_local);
  if (local_14a == 0xc0) {
    uVar10 = UnalignedLoad<unsigned_long>((char *)ctx_local);
    puVar11 = RefAt<unsigned_long>(local_198,(ulong)pFStack_138->offset);
    *puVar11 = uVar10;
    ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
  }
  else {
    uVar7 = UnalignedLoad<unsigned_int>((char *)ctx_local);
    puVar12 = RefAt<unsigned_int>(local_198,(ulong)pFStack_138->offset);
    *puVar12 = uVar7;
    ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
  }
  pcVar8 = ptr_local;
  pPVar2 = ctx_local;
  pTVar1 = table_local;
  TcFieldData::TcFieldData((TcFieldData *)&local_1a0);
  local_b8 = local_1a0;
  local_c0 = (MessageLite *)pcVar8;
  local_c8 = pPVar2;
  local_d0 = (ParseContext *)pTVar1;
  local_d8 = (TcParseTableBase *)hasbits_local;
  pFStack_e0 = entry;
  local_e1 = 0;
  bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)pTVar1,(char *)pPVar2);
  x = local_c0;
  p = local_c8;
  pPVar2 = local_d0;
  if (bVar4) {
    TcFieldData::TcFieldData(&local_f8);
    pTVar1 = local_d8;
    pFVar3 = pFStack_e0;
    uVar5 = UnalignedLoad<unsigned_short>((char *)p);
    uVar13 = (ulong)(int)((uint)uVar5 & (uint)pTVar1->fast_idx_mask);
    if ((uVar13 & 7) == 0) {
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           TcParseTableBase::fast_entry(pTVar1,uVar13 >> 3);
      local_a8.data =
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
           (ulong)uVar5;
      UNRECOVERED_JUMPTABLE =
           TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_b0.data = local_a8.data;
      pcVar8 = (*UNRECOVERED_JUMPTABLE)
                         (x,(char *)p,pPVar2,(TcFieldData)local_a8,pTVar1,(uint64_t)pFVar3);
      return pcVar8;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  TcFieldData::TcFieldData(&local_f0);
  if (local_d8->has_bits_offset != 0) {
    uVar7 = (uint)pFStack_e0;
    puVar12 = RefAt<unsigned_int>(x,(ulong)(uint)local_d8->has_bits_offset);
    *puVar12 = uVar7 | *puVar12;
  }
  return (char *)p;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpFixed(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing (wiretype fallback is handled there):
  if (card == field_layout::kFcRepeated) {
    PROTOBUF_MUSTTAIL return MpRepeatedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }
  // Check for mismatched wiretype:
  const uint16_t rep = type_card & field_layout::kRepMask;
  const uint32_t decoded_wiretype = data.tag() & 7;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }
  // Set the field present:
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (card == field_layout::kFcOneof) {
    ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  // Copy the value:
  if (rep == field_layout::kRep64Bits) {
    RefAt<uint64_t>(base, entry.offset) = UnalignedLoad<uint64_t>(ptr);
    ptr += sizeof(uint64_t);
  } else {
    RefAt<uint32_t>(base, entry.offset) = UnalignedLoad<uint32_t>(ptr);
    ptr += sizeof(uint32_t);
  }
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}